

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::btToPos(SAT *this,int sat_pos,int core_pos)

{
  untrailToPos(this,(this->trail).data + ((this->trail).sz - 1),sat_pos);
  Engine::btToPos(&engine,core_pos);
  return;
}

Assistant:

void SAT::btToPos(int sat_pos, int core_pos) {
	untrailToPos(trail.last(), sat_pos);
	engine.btToPos(core_pos);
}